

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseXMLDocument(TidyDocImpl *doc)

{
  Node **ppNVar1;
  NodeType NVar2;
  Node *pNVar3;
  Bool BVar4;
  Node *node;
  uint code;
  Node **ppNVar5;
  TidyDocImpl *element;
  Node *pNVar6;
  
  prvTidySetOptionBool(doc,TidyXmlTags,yes);
  doc->xmlDetected = yes;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    ppNVar1 = &(doc->root).content;
    pNVar6 = (Node *)0x0;
    do {
      if (node->type == EndTag) {
        code = 0x287;
        element = (TidyDocImpl *)0x0;
LAB_00143820:
        prvTidyReport(doc,&element->root,node,code);
        prvTidyFreeNode(doc,node);
      }
      else {
        BVar4 = InsertMisc(&doc->root,node);
        if (BVar4 == no) {
          NVar2 = node->type;
          if (NVar2 == StartTag) {
            node->parent = &doc->root;
            pNVar3 = (doc->root).last;
            node->prev = pNVar3;
            ppNVar5 = &pNVar3->next;
            if (pNVar3 == (Node *)0x0) {
              ppNVar5 = ppNVar1;
            }
            *ppNVar5 = node;
            (doc->root).last = node;
            ParseXMLElement(doc,node,IgnoreWhitespace);
          }
          else if (NVar2 == StartEndTag) {
            node->parent = &doc->root;
            pNVar3 = (doc->root).last;
            node->prev = pNVar3;
            ppNVar5 = &pNVar3->next;
            if (pNVar3 == (Node *)0x0) {
              ppNVar5 = ppNVar1;
            }
            *ppNVar5 = node;
            (doc->root).last = node;
          }
          else {
            if ((NVar2 != DocTypeTag) || (pNVar6 != (Node *)0x0)) {
              code = 0x235;
              element = doc;
              goto LAB_00143820;
            }
            node->parent = &doc->root;
            pNVar6 = (doc->root).last;
            ppNVar5 = &pNVar6->next;
            if (pNVar6 == (Node *)0x0) {
              ppNVar5 = ppNVar1;
            }
            node->prev = pNVar6;
            *ppNVar5 = node;
            (doc->root).last = node;
            pNVar6 = node;
          }
        }
      }
      node = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (node != (Node *)0x0);
  }
  if (*(int *)((doc->config).value + 99) == 0) {
    return;
  }
  prvTidyFixXmlDecl(doc);
  return;
}

Assistant:

void TY_(ParseXMLDocument)(TidyDocImpl* doc)
{
    Node *node, *doctype = NULL;

    TY_(SetOptionBool)( doc, TidyXmlTags, yes );

    doc->xmlDetected = yes;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            TY_(Report)(doc, NULL, node, UNEXPECTED_ENDTAG);
            TY_(FreeNode)( doc, node);
            continue;
        }

         /* deal with comments etc. */
        if (InsertMisc( &doc->root, node))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == StartEndTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node);
            continue;
        }

       /* if start tag then parse element's content */
        if (node->type == StartTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node );
            ParseXMLElement( doc, node, IgnoreWhitespace );
            continue;
        }

        TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    /* ensure presence of initial <?xml version="1.0"?> */
    if ( cfgBool(doc, TidyXmlDecl) )
        TY_(FixXmlDecl)( doc );
}